

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mttc0_entryhi_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint uVar1;
  uint32_t uVar2;
  CPUMIPSState *pCVar3;
  uint32_t uVar4;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar2 = env->current_tc;
    uVar4 = uVar2;
  }
  else {
    uVar4 = (uint32_t)
            ((long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c));
    uVar2 = env->current_tc;
  }
  env->CP0_EntryHi = arg1;
  pCVar3 = (CPUMIPSState *)(env->tcs + (int)uVar4);
  if (uVar2 == uVar4) {
    pCVar3 = env;
  }
  uVar1 = (pCVar3->active_tc).CP0_TCStatus;
  (pCVar3->active_tc).CP0_TCStatus = (arg1 ^ uVar1) & env->CP0_EntryHi_ASID_mask ^ uVar1;
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}